

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdi::ControlContainer::ControlContainer(ControlContainer *this,QMdiSubWindow *mdiChild)

{
  QPointer<QWidget> *this_00;
  QPointer<QWidget> *this_01;
  Data *pDVar1;
  ControlElement<QMdi::ControllerWidget> *this_02;
  ControlElement<QMdi::ControlLabel> *this_03;
  QObject *pQVar2;
  QWidget *this_04;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QObject local_68 [8];
  QObject local_60 [8];
  undefined1 local_58 [16];
  QObject local_48 [8];
  QObject local_40 [8];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,(QObject *)mdiChild);
  *(undefined ***)this = &PTR_metaObject_007d0378;
  this_00 = &this->m_controllerWidget;
  (this->previousLeft).wp.d = (Data *)0x0;
  (this->previousLeft).wp.value = (QObject *)0x0;
  (this->previousRight).wp.d = (Data *)0x0;
  (this->previousRight).wp.value = (QObject *)0x0;
  (this->m_menuBar).wp.d = (Data *)0x0;
  (this->m_menuBar).wp.value = (QObject *)0x0;
  (this->m_controllerWidget).wp.d = (Data *)0x0;
  (this->m_controllerWidget).wp.value = (QObject *)0x0;
  (this->m_menuLabel).wp.d = (Data *)0x0;
  (this->m_menuLabel).wp.value = (QObject *)0x0;
  QPointer<QMdiSubWindow>::QPointer<void>(&this->mdiChild,mdiChild);
  this_02 = (ControlElement<QMdi::ControllerWidget> *)operator_new(0x48);
  ControlElement<QMdi::ControllerWidget>::ControlElement(this_02,mdiChild);
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)this_02);
  pDVar1 = (this->m_controllerWidget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = (this->m_controllerWidget).wp.value;
  }
  pQVar3 = (QObject *)0x0;
  QObject::connect(local_40,(char *)pQVar2,(QObject *)"2_q_close()",(char *)mdiChild,0x5f71fe);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pDVar1 = (this_00->wp).d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->m_controllerWidget).wp.value;
    }
  }
  this_01 = &this->m_menuLabel;
  pQVar2 = (QObject *)0x0;
  QObject::connect(local_48,(char *)pQVar3,(QObject *)"2_q_restore()",(char *)mdiChild,0x660168);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pDVar1 = (this_00->wp).d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = (this->m_controllerWidget).wp.value;
    }
  }
  this_04 = (QWidget *)0x0;
  QObject::connect((QObject *)(local_58 + 8),(char *)pQVar2,(QObject *)"2_q_minimize()",
                   (char *)mdiChild,0x660185);
  QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
  this_03 = (ControlElement<QMdi::ControlLabel> *)operator_new(0x58);
  ControlElement<QMdi::ControlLabel>::ControlElement(this_03,mdiChild);
  QWeakPointer<QObject>::assign<QObject>(&this_01->wp,(QObject *)this_03);
  pDVar1 = (this_01->wp).d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      this_04 = (QWidget *)0x0;
    }
    else {
      this_04 = (QWidget *)(this->m_menuLabel).wp.value;
    }
  }
  QWidget::windowIcon((QWidget *)local_58);
  QWidget::setWindowIcon(this_04,(QIcon *)local_58);
  QIcon::~QIcon((QIcon *)local_58);
  pDVar1 = (this_01->wp).d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = (this->m_menuLabel).wp.value;
  }
  pQVar3 = (QObject *)0x0;
  QObject::connect(local_60,(char *)pQVar2,(QObject *)"2_q_clicked()",(char *)mdiChild,0x6601a4);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pDVar1 = (this_01->wp).d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->m_menuLabel).wp.value;
    }
  }
  QObject::connect(local_68,(char *)pQVar3,(QObject *)"2_q_doubleClicked()",(char *)mdiChild,
                   0x5f71fe);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlContainer::ControlContainer(QMdiSubWindow *mdiChild)
    : QObject(mdiChild),
      previousLeft(nullptr),
      previousRight(nullptr),
#if QT_CONFIG(menubar)
      m_menuBar(nullptr),
#endif
      mdiChild(mdiChild)
{
    Q_ASSERT(mdiChild);

    m_controllerWidget = new ControlElement<ControllerWidget>(mdiChild);
    connect(m_controllerWidget, SIGNAL(_q_close()), mdiChild, SLOT(close()));
    connect(m_controllerWidget, SIGNAL(_q_restore()), mdiChild, SLOT(showNormal()));
    connect(m_controllerWidget, SIGNAL(_q_minimize()), mdiChild, SLOT(showMinimized()));

    m_menuLabel = new ControlElement<ControlLabel>(mdiChild);
    m_menuLabel->setWindowIcon(mdiChild->windowIcon());
#if QT_CONFIG(menu)
    connect(m_menuLabel, SIGNAL(_q_clicked()), mdiChild, SLOT(showSystemMenu()));
#endif
    connect(m_menuLabel, SIGNAL(_q_doubleClicked()), mdiChild, SLOT(close()));
}